

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::convert_separate_image_to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  uint32_t id_00;
  SPIRVariable *pSVar1;
  CompilerError *this_00;
  char (*in_stack_fffffffffffffdb0) [2];
  VariableID local_21c;
  VariableID local_218;
  allocator local_211;
  string local_210;
  string local_1f0;
  string local_1d0;
  spirv_cross local_1a0 [32];
  undefined1 local_180 [8];
  SPIRType sampled_type;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  pSVar1 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id);
  if (pSVar1 != (SPIRVariable *)0x0) {
    id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar1->super_IVariant).field_0xc);
    sampled_type.member_name_cache._M_h._M_single_bucket =
         (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id_00);
    if (((((SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket)->basetype == Image) &&
        ((((SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket)->image).sampled == 1))
       && ((((SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket)->image).dim !=
           DimBuffer)) {
      if (((this->options).vulkan_semantics & 1U) == 0) {
        if ((this->super_Compiler).dummy_sampler_id != 0) {
          TypedID<(spirv_cross::Types)2>::TypedID(&local_218,id);
          TypedID<(spirv_cross::Types)2>::TypedID
                    (&local_21c,(this->super_Compiler).dummy_sampler_id);
          to_combined_image_sampler_abi_cxx11_(__return_storage_ptr__,this,local_218,local_21c);
          return __return_storage_ptr__;
        }
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Cannot find dummy sampler ID. Was build_dummy_sampler_for_combined_images() called?"
                  );
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((this->super_Compiler).dummy_sampler_id != 0) {
        SPIRType::SPIRType((SPIRType *)local_180,
                           (SPIRType *)sampled_type.member_name_cache._M_h._M_single_bucket);
        sampled_type.super_IVariant.self.id = 0x11;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1a0,this,(SPIRType *)local_180,0);
        to_non_uniform_aware_expression_abi_cxx11_(&local_1d0,this,id);
        to_expression_abi_cxx11_(&local_1f0,this,(this->super_Compiler).dummy_sampler_id,true);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                  (__return_storage_ptr__,local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
                   (char (*) [2])&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
                   (char (*) [3])&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
                   in_stack_fffffffffffffdb0);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
        ::std::__cxx11::string::~string((string *)local_1a0);
        SPIRType::~SPIRType((SPIRType *)local_180);
        return __return_storage_ptr__;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_210,"GL_EXT_samplerless_texture_functions",&local_211);
      require_extension_internal(this,&local_210);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
  }
  to_non_uniform_aware_expression_abi_cxx11_(__return_storage_ptr__,this,id);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_separate_image_to_expression(uint32_t id)
{
	auto *var = maybe_get_backing_variable(id);

	// If we are fetching from a plain OpTypeImage, we must combine with a dummy sampler in GLSL.
	// In Vulkan GLSL, we can make use of the newer GL_EXT_samplerless_texture_functions.
	if (var)
	{
		auto &type = get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (options.vulkan_semantics)
			{
				if (dummy_sampler_id)
				{
					// Don't need to consider Shadow state since the dummy sampler is always non-shadow.
					auto sampled_type = type;
					sampled_type.basetype = SPIRType::SampledImage;
					return join(type_to_glsl(sampled_type), "(", to_non_uniform_aware_expression(id), ", ",
					            to_expression(dummy_sampler_id), ")");
				}
				else
				{
					// Newer glslang supports this extension to deal with texture2D as argument to texture functions.
					require_extension_internal("GL_EXT_samplerless_texture_functions");
				}
			}
			else
			{
				if (!dummy_sampler_id)
					SPIRV_CROSS_THROW("Cannot find dummy sampler ID. Was "
					                  "build_dummy_sampler_for_combined_images() called?");

				return to_combined_image_sampler(id, dummy_sampler_id);
			}
		}
	}

	return to_non_uniform_aware_expression(id);
}